

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O2

void __thiscall Engine_testIncrTagsVector_Test::TestBody(Engine_testIncrTagsVector_Test *this)

{
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *pvVar1;
  long lVar2;
  char *pcVar3;
  AssertHelper local_e0;
  AssertHelper local_d8;
  AssertionResult gtest_ar_1;
  _Head_base<0UL,_Handler_*,_false> local_b0;
  value_type im;
  vector<Tag,_std::allocator<Tag>_> tags;
  Engine e;
  
  std::make_unique<TestHandler>();
  local_b0._M_head_impl = (Handler *)im.time;
  im.time.__d.__r = (duration)0;
  Engine::Engine(&e,"test",(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_b0);
  if (local_b0._M_head_impl != (Handler *)0x0) {
    (*(local_b0._M_head_impl)->_vptr_Handler[3])();
  }
  local_b0._M_head_impl = (Handler *)0x0;
  if (im.time.__d.__r != 0) {
    (**(code **)(*(long *)im.time.__d.__r + 0x18))();
  }
  tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Tag,_std::allocator<Tag>_>::reserve(&tags,2);
  std::__cxx11::string::string((string *)&im,"Foo",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&gtest_ar_1,"Bar",(allocator *)&local_d8);
  std::vector<Tag,std::allocator<Tag>>::
  emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((vector<Tag,std::allocator<Tag>> *)&tags,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&im,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&im);
  std::__cxx11::string::string((string *)&im,"Hello",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&gtest_ar_1,"World",(allocator *)&local_d8);
  std::vector<Tag,std::allocator<Tag>>::
  emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((vector<Tag,std::allocator<Tag>> *)&tags,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&im,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&im);
  std::__cxx11::string::string((string *)&im,"foo",(allocator *)&gtest_ar_1);
  Engine::Incr(&e,(string *)&im,&tags);
  std::__cxx11::string::~string((string *)&im);
  pvVar1 = Engine::GetHandlers(&e);
  lVar2 = __dynamic_cast((_Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>)
                         (((pvVar1->
                           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>._M_t,
                         &Handler::typeinfo,&TestHandler::typeinfo,0);
  local_e0.data_._0_4_ = 1;
  gtest_ar_1._0_8_ = (*(long *)(lVar2 + 0x10) - *(long *)(lVar2 + 8)) / 0x50;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&im,"1","th->intMeasures.size()",(int *)&local_e0,
             (unsigned_long *)&gtest_ar_1);
  if ((char)im.time.__d.__r == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (im.name._M_dataplus._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)im.name._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0x56,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&im.name);
    goto LAB_001138a0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&im.name);
  Measure<int>::Measure(&im,*(Measure<int> **)(lVar2 + 8));
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"test.foo\"","im.name",(char (*) [9])"test.foo",&im.name);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0x58,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
LAB_00113875:
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_e0.data_ = local_e0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<MetricTypes::MetricType,MetricTypes::MetricType>
              ((internal *)&gtest_ar_1,"MetricType::Counter","im.type",(MetricType *)&local_e0,
               &im.type);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_e0);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x59,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
      goto LAB_00113875;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_e0.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,float>
              ((internal *)&gtest_ar_1,"1","im.rate",(int *)&local_e0,&im.rate);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_e0);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x5a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
      goto LAB_00113875;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_e0.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_1,"1","im.value",(int *)&local_e0,&im.value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_e0);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x5b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
      goto LAB_00113875;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_d8.data_._0_4_ = 2;
    local_e0.data_ =
         (AssertHelperData *)
         ((long)im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_start >> 6);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar_1,"2","im.tags.size()",(int *)&local_d8,
               (unsigned_long *)&local_e0);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_e0);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x5c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
      goto LAB_00113875;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"Foo\"","im.tags[0].name",(char (*) [4])"Foo",
               &(im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                 super__Vector_impl_data._M_start)->name);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_e0);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x5d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
      goto LAB_00113875;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"Bar\"","im.tags[0].value",(char (*) [4])"Bar",
               &(im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                 super__Vector_impl_data._M_start)->value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_e0);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x5e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
      goto LAB_00113875;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"Hello\"","im.tags[1].name",(char (*) [6])"Hello",
               &im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_start[1].name);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_e0);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x5f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
      goto LAB_00113875;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"World\"","im.tags[1].value",(char (*) [6])"World",
               &im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_start[1].value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_e0);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x60,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_e0);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  Measure<int>::~Measure(&im);
LAB_001138a0:
  std::vector<Tag,_std::allocator<Tag>_>::~vector(&tags);
  Engine::~Engine(&e);
  return;
}

Assistant:

TEST(Engine, testIncrTagsVector) {
    Engine e("test", std::make_unique<TestHandler>());
    std::vector<Tag> tags;
    tags.reserve(2);
    Tag::appendTag(tags, "Foo", "Bar");
    Tag::appendTag(tags, "Hello", "World");

    e.Incr("foo", tags);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.foo", im.name);
    ASSERT_EQ(MetricType::Counter, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(1, im.value);
    ASSERT_EQ(2, im.tags.size());
    ASSERT_EQ("Foo", im.tags[0].name);
    ASSERT_EQ("Bar", im.tags[0].value);
    ASSERT_EQ("Hello", im.tags[1].name);
    ASSERT_EQ("World", im.tags[1].value);
}